

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

N_Vector N_VNew_Serial(sunindextype length,SUNContext sunctx)

{
  void *pvVar1;
  N_Vector v;
  void *pvVar2;
  
  v = N_VNewEmpty_Serial(length,sunctx);
  if (v != (N_Vector)0x0) {
    if (length < 1) {
      return v;
    }
    pvVar2 = malloc((ulong)(uint)length << 3);
    if (pvVar2 != (void *)0x0) {
      pvVar1 = v->content;
      *(undefined4 *)((long)pvVar1 + 4) = 1;
      *(void **)((long)pvVar1 + 8) = pvVar2;
      return v;
    }
    N_VDestroy_Serial(v);
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VNew_Serial(sunindextype length, SUNContext sunctx)
{
  N_Vector v;
  realtype *data;

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  if (v == NULL) return(NULL);

  /* Create data */
  if (length > 0) {

    /* Allocate memory */
    data = NULL;
    data = (realtype *) malloc(length * sizeof(realtype));
    if(data == NULL) { N_VDestroy_Serial(v); return(NULL); }

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;

  }

  return(v);
}